

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_keys.cpp
# Opt level: O0

void ClearLocks(void)

{
  Lock *this;
  bool bVar1;
  uint uVar2;
  PClassActor **ppPVar3;
  AActor *pAVar4;
  AKey *key;
  uint i;
  
  for (key._4_4_ = 0;
      uVar2 = TArray<PClassActor_*,_PClassActor_*>::Size(&PClassActor::AllActorClasses),
      key._4_4_ < uVar2; key._4_4_ = key._4_4_ + 1) {
    ppPVar3 = TArray<PClassActor_*,_PClassActor_*>::operator[]
                        (&PClassActor::AllActorClasses,(ulong)key._4_4_);
    bVar1 = PClass::IsDescendantOf(&(*ppPVar3)->super_PClass,AKey::RegistrationInfo.MyClass);
    if (bVar1) {
      ppPVar3 = TArray<PClassActor_*,_PClassActor_*>::operator[]
                          (&PClassActor::AllActorClasses,(ulong)key._4_4_);
      pAVar4 = GetDefaultByType(&(*ppPVar3)->super_PClass);
      if (pAVar4 != (AActor *)0x0) {
        *(undefined1 *)((long)&pAVar4[1].snext + 4) = 0;
      }
    }
  }
  for (key._4_4_ = 0; key._4_4_ < 0x100; key._4_4_ = key._4_4_ + 1) {
    if (locks[key._4_4_] != (Lock *)0x0) {
      this = locks[key._4_4_];
      if (this != (Lock *)0x0) {
        Lock::~Lock(this);
        operator_delete(this,0x38);
      }
      locks[key._4_4_] = (Lock *)0x0;
    }
  }
  currentnumber = 0;
  keysdone = false;
  return;
}

Assistant:

static void ClearLocks()
{
	unsigned int i;
	for(i = 0; i < PClassActor::AllActorClasses.Size(); i++)
	{
		if (PClassActor::AllActorClasses[i]->IsDescendantOf(RUNTIME_CLASS(AKey)))
		{
			AKey *key = static_cast<AKey*>(GetDefaultByType(PClassActor::AllActorClasses[i]));
			if (key != NULL)
			{
				key->KeyNumber = 0;
			}
		}
	}
	for(i = 0; i < 256; i++)
	{
		if (locks[i] != NULL) 
		{
			delete locks[i];
			locks[i] = NULL;
		}
	}
	currentnumber = 0;
	keysdone = false;
}